

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_flow_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  long *plVar1;
  gtoken_t gVar2;
  long lVar3;
  void *pvVar4;
  gnode_binary_expr_t *expr;
  long lVar5;
  gnode_t *pgVar6;
  
  pgVar6 = node->cond;
  if (((pgVar6 != (gnode_t *)0x0) && (pgVar6->tag == NODE_BINARY_EXPR)) && (pgVar6[1].tag == 0x45))
  {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar6,"Assignment not allowed here");
  }
  gVar2 = (node->base).token.type;
  if (gVar2 == TOK_OP_TERNARY) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    pgVar6 = node->elsestmt;
LAB_0011e2f2:
    gvisit(self,pgVar6);
    return;
  }
  if (gVar2 == TOK_KEY_SWITCH) {
    pvVar4 = self->data;
    lVar3 = *(long *)((long)pvVar4 + 0x10);
    if (*(long *)((long)pvVar4 + 8) == lVar3) {
      lVar5 = 8;
      if (lVar3 != 0) {
        lVar5 = lVar3 * 2;
      }
      *(long *)((long)pvVar4 + 0x10) = lVar5;
      pvVar4 = realloc(*(void **)((long)pvVar4 + 0x18),lVar5 * 2);
      *(void **)((long)self->data + 0x18) = pvVar4;
    }
    pvVar4 = self->data;
    lVar3 = *(long *)((long)pvVar4 + 8);
    *(long *)((long)pvVar4 + 8) = lVar3 + 1;
    *(undefined2 *)(*(long *)((long)pvVar4 + 0x18) + lVar3 * 2) = 0xf;
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    plVar1 = (long *)((long)self->data + 8);
    *plVar1 = *plVar1 + -1;
  }
  else if (gVar2 == TOK_KEY_IF) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    pgVar6 = node->elsestmt;
    if (pgVar6 != (gnode_t *)0x0) goto LAB_0011e2f2;
  }
  return;
}

Assistant:

static void visit_flow_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH) || (type == TOK_OP_TERNARY));

    if (type == TOK_KEY_IF) {
        visit_flow_if_stmt(self, node);
    } else if (type == TOK_KEY_SWITCH) {
        visit_flow_switch_stmt(self, node);
    } else if (type == TOK_OP_TERNARY) {
        visit_flow_ternary_stmt(self, node);
    }
}